

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O1

int symtab_put(symtab *tab,char *cname,int type,int data)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  char *str;
  symtab_sym *psVar5;
  ulong uVar6;
  int *piVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  int iVar11;
  ulong uVar12;
  
  iVar2 = symtab_get(tab,cname,(int *)0x0,(int *)0x0);
  iVar11 = -1;
  if (iVar2 == -1) {
    str = strdup(cname);
    uVar3 = elf_hash(str);
    uVar8 = uVar3 % (uint)tab->bucketsnum;
    iVar11 = tab->symsnum;
    iVar2 = tab->buckets[(int)uVar8];
    tab->buckets[(int)uVar8] = iVar11;
    iVar1 = tab->symsmax;
    if (iVar1 <= tab->symsnum) {
      iVar4 = 0x10;
      if (iVar1 != 0) {
        iVar4 = iVar1 * 2;
      }
      tab->symsmax = iVar4;
      psVar5 = (symtab_sym *)realloc(tab->syms,(long)iVar4 * 0x18);
      tab->syms = psVar5;
    }
    psVar5 = tab->syms;
    iVar1 = tab->symsnum;
    tab->symsnum = iVar1 + 1;
    psVar5[iVar1].name = str;
    psVar5[iVar1].hash = uVar3;
    psVar5[iVar1].hchain = iVar2;
    psVar5[iVar1].type = type;
    psVar5[iVar1].data = data;
    if (tab->bucketsnum != 0x10000000 && tab->bucketsnum < tab->symsnum) {
      free(tab->buckets);
      piVar10 = primes;
      uVar6 = 0;
      do {
        if (tab->symsnum <= *piVar10) goto LAB_00251572;
        uVar6 = uVar6 + 1;
        piVar10 = piVar10 + 1;
      } while (uVar6 != 0xb);
      uVar6 = 0xb;
LAB_00251572:
      uVar8 = primes[uVar6 & 0xffffffff];
      tab->bucketsnum = uVar8;
      piVar10 = (int *)malloc((long)(int)uVar8 << 2);
      tab->buckets = piVar10;
      uVar6 = 1;
      if (1 < (int)uVar8) {
        uVar6 = (ulong)uVar8;
      }
      memset(piVar10,0xff,uVar6 << 2);
      if (0 < tab->symsnum) {
        uVar8 = tab->bucketsnum;
        uVar6 = 1;
        if (1 < tab->symsnum) {
          uVar6 = (ulong)(uint)tab->symsnum;
        }
        piVar7 = &tab->syms->hchain;
        uVar12 = 0;
        do {
          uVar9 = (uint)piVar7[-1] % uVar8;
          *piVar7 = piVar10[(int)uVar9];
          piVar10[(int)uVar9] = (int)uVar12;
          uVar12 = uVar12 + 1;
          piVar7 = piVar7 + 6;
        } while (uVar6 != uVar12);
      }
    }
  }
  return iVar11;
}

Assistant:

int symtab_put(struct symtab *tab, const char *cname, int type, int data) {
	if (symtab_get(tab, cname, 0, 0) != -1)
		return -1;
	char *name = strdup(cname);
	struct symtab_sym sym;
	uint32_t hash = elf_hash(name);
	int bucket = hash % tab->bucketsnum;
	int res = tab->symsnum;
	sym.name = name;
	sym.type = type;
	sym.data = data;
	sym.hash = hash;
	sym.hchain = tab->buckets[bucket];
	tab->buckets[bucket] = res;
	ADDARRAY(tab->syms, sym);
	if (tab->symsnum > tab->bucketsnum && tab->bucketsnum != primes[numprimes-1]) {
		/* rehash */
		int i;
		free(tab->buckets);
		for (i = 0; i < numprimes-1; i++)
			if (tab->symsnum <= primes[i])
				break;
		tab->bucketsnum = primes[i];
		tab->buckets = malloc(tab->bucketsnum * sizeof *tab->buckets);
		for (i = 0; i < tab->bucketsnum; i++)
			tab->buckets[i] = -1;
		for (i = 0; i < tab->symsnum; i++) {
			bucket = tab->syms[i].hash % tab->bucketsnum;
			tab->syms[i].hchain = tab->buckets[bucket];
			tab->buckets[bucket] = i;
		}
	}
	return res;
}